

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_seed(Curl_easy *data)

{
  undefined1 *puVar1;
  _Bool _Var2;
  CURLcode CVar3;
  
  if ((data->multi == (Curl_multi *)0x0) || (CVar3 = CURLE_OK, (data->multi->field_0x271 & 8) == 0))
  {
    _Var2 = rand_enough();
    if (_Var2) {
      CVar3 = CURLE_OK;
      if (data->multi != (Curl_multi *)0x0) {
        puVar1 = &data->multi->field_0x271;
        *puVar1 = *puVar1 | 8;
      }
    }
    else {
      Curl_failf(data,"Insufficient randomness");
      CVar3 = CURLE_SSL_CONNECT_ERROR;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ossl_seed(struct Curl_easy *data)
{
  /* This might get called before it has been added to a multi handle */
  if(data->multi && data->multi->ssl_seeded)
    return CURLE_OK;

  if(rand_enough()) {
    /* OpenSSL 1.1.0+ should return here */
    if(data->multi)
      data->multi->ssl_seeded = TRUE;
    return CURLE_OK;
  }
#ifdef HAVE_RANDOM_INIT_BY_DEFAULT
  /* with OpenSSL 1.1.0+, a failed RAND_status is a showstopper */
  failf(data, "Insufficient randomness");
  return CURLE_SSL_CONNECT_ERROR;
#else

  /* fallback to a custom seeding of the PRNG using a hash based on a current
     time */
  do {
    unsigned char randb[64];
    size_t len = sizeof(randb);
    size_t i, i_max;
    for(i = 0, i_max = len / sizeof(struct curltime); i < i_max; ++i) {
      struct curltime tv = Curl_now();
      Curl_wait_ms(1);
      tv.tv_sec *= (time_t)i + 1;
      tv.tv_usec *= (int)i + 2;
      tv.tv_sec ^= ((Curl_now().tv_sec + (time_t)Curl_now().tv_usec) *
                    (time_t)(i + 3)) << 8;
      tv.tv_usec ^= (int) ((Curl_now().tv_sec + (time_t)Curl_now().tv_usec) *
                           (time_t)(i + 4)) << 16;
      memcpy(&randb[i * sizeof(struct curltime)], &tv,
             sizeof(struct curltime));
    }
    RAND_add(randb, (int)len, (double)len/2);
  } while(!rand_enough());

  /*
   * Number of bytes to read from the random number seed file. This must be
   * a finite value (because some entropy "files" like /dev/urandom have
   * an infinite length), but must be large enough to provide enough
   * entropy to properly seed OpenSSL's PRNG.
   */
#  define RAND_LOAD_LENGTH 1024

  {
    /* generates a default path for the random seed file */
    char fname[256];
    fname[0] = 0; /* blank it first */
    RAND_file_name(fname, sizeof(fname));
    if(fname[0]) {
      /* we got a filename to try */
      RAND_load_file(fname, RAND_LOAD_LENGTH);
      if(rand_enough())
        return CURLE_OK;
    }
  }

  infof(data, "libcurl is now using a weak random seed");
  return rand_enough() ? CURLE_OK :
         CURLE_SSL_CONNECT_ERROR; /* confusing error code */
#endif
}